

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

bool __thiscall QDateTime::equals(QDateTime *this,QDateTime *other)

{
  bool bVar1;
  QDateTimeData *leftMillis;
  QDateTimeData *a;
  qint64 qVar2;
  qint64 qVar3;
  QDateTimeData *in_RDI;
  qint64 yourMs;
  qint64 thisMs;
  QDateTimeData *in_stack_ffffffffffffffc8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = isValid((QDateTime *)&in_RDI->data);
  if (bVar1) {
    bVar1 = isValid((QDateTime *)&in_RDI->data);
    if (bVar1) {
      leftMillis = (QDateTimeData *)getMSecs(in_stack_ffffffffffffffc8);
      a = (QDateTimeData *)getMSecs(in_stack_ffffffffffffffc8);
      bVar1 = usesSameOffset(a,in_RDI);
      if ((!bVar1) && (bVar1 = areFarEnoughApart((qint64)leftMillis,(qint64)a), !bVar1)) {
        qVar2 = toMSecsSinceEpoch((QDateTime *)
                                  CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
        qVar3 = toMSecsSinceEpoch((QDateTime *)
                                  CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
        return qVar2 == qVar3;
      }
      bVar1 = leftMillis == a;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = isValid((QDateTime *)&in_RDI->data);
    bVar1 = (bool)((bVar1 ^ 0xffU) & 1);
  }
  return bVar1;
}

Assistant:

bool QDateTime::equals(const QDateTime &other) const
{
    if (!isValid())
        return !other.isValid();
    if (!other.isValid())
        return false;

    const qint64 thisMs = getMSecs(d);
    const qint64 yourMs = getMSecs(other.d);
    if (usesSameOffset(d, other.d) || areFarEnoughApart(thisMs, yourMs))
        return thisMs == yourMs;

    // Convert to UTC and compare
    return toMSecsSinceEpoch() == other.toMSecsSinceEpoch();
}